

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O0

void __thiscall libDAI::HAK::constructMessages(HAK *this)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  FRegion *this_00;
  VarSet *ns;
  long *in_RDI;
  const_iterator ab;
  size_t beta;
  size_t alpha;
  value_type *in_stack_fffffffffffffe48;
  RegionGraph *in_stack_fffffffffffffe50;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this_01;
  VarSet *in_stack_fffffffffffffe68;
  TFactor<double> *in_stack_fffffffffffffe70;
  TFactor<double> *this_02;
  size_type in_stack_fffffffffffffe88;
  long *__n;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffe90;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_a0 [8];
  ulong local_60;
  ulong local_10;
  
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb473eb)
  ;
  (**(code **)(*in_RDI + 0x28))();
  RegionGraph::nr_ORs((RegionGraph *)0xb47412);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_10 = 0;
  while( true ) {
    uVar1 = local_10;
    (**(code **)(*in_RDI + 0x28))();
    sVar3 = RegionGraph::nr_ORs((RegionGraph *)0xb47451);
    if (sVar3 <= uVar1) break;
    (**(code **)(*in_RDI + 0x28))();
    this_00 = RegionGraph::OR(in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48);
    TFactor<double>::vars(&this_00->super_Factor);
    TFactor<double>::TFactor(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe50);
    local_10 = local_10 + 1;
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb4751f)
  ;
  (**(code **)(*in_RDI + 0x28))();
  RegionGraph::nr_IRs((RegionGraph *)0xb47543);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_60 = 0;
  while( true ) {
    uVar1 = local_60;
    (**(code **)(*in_RDI + 0x28))();
    sVar3 = RegionGraph::nr_IRs((RegionGraph *)0xb4757f);
    if (sVar3 <= uVar1) break;
    in_stack_fffffffffffffe90 =
         (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
         (in_RDI + 0x49);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::IR(in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48);
    TFactor<double>::TFactor(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe50);
    local_60 = local_60 + 1;
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb47645)
  ;
  (**(code **)(*in_RDI + 0x28))();
  RegionGraph::nr_Redges((RegionGraph *)0xb47669);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb4768a)
  ;
  __n = in_RDI + 0x4f;
  (**(code **)(*in_RDI + 0x28))();
  RegionGraph::nr_Redges((RegionGraph *)0xb476ae);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (in_stack_fffffffffffffe90,(size_type)__n);
  (**(code **)(*in_RDI + 0x28))();
  RegionGraph::Redges((RegionGraph *)0xb476d1);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)in_stack_fffffffffffffe48);
  __gnu_cxx::
  __normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
  ::__normal_iterator<std::pair<unsigned_long,unsigned_long>*>
            ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)in_stack_fffffffffffffe50,
             (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)in_stack_fffffffffffffe48);
  while( true ) {
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::Redges((RegionGraph *)0xb4770c);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)in_stack_fffffffffffffe48);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffe50,
                       (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar2) break;
    this_02 = (TFactor<double> *)(in_RDI + 0x4c);
    ns = (VarSet *)(**(code **)(*in_RDI + 0x28))();
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator->(local_a0);
    RegionGraph::IR(in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48);
    TFactor<double>::TFactor(this_02,ns);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe50);
    this_01 = (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               *)(in_RDI + 0x4f);
    in_stack_fffffffffffffe50 = (RegionGraph *)(**(code **)(*in_RDI + 0x28))();
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator->(local_a0);
    RegionGraph::IR(in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48);
    TFactor<double>::TFactor(this_02,ns);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe50);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(this_01,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  }
  return;
}

Assistant:

void HAK::constructMessages() {
        // Create outer beliefs
        _Qa.clear();
        _Qa.reserve(grm().nr_ORs());
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( Factor( grm().OR(alpha).vars() ) );

        // Create inner beliefs
        _Qb.clear();
        _Qb.reserve(grm().nr_IRs());
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            _Qb.push_back( Factor( grm().IR(beta) ) );
        
        // Create messages
        _muab.clear();
        _muab.reserve(grm().nr_Redges());
        _muba.clear();
        _muba.reserve(grm().nr_Redges());
        for( vector<RegionGraph::R_edge_t>::const_iterator ab = grm().Redges().begin(); ab != grm().Redges().end(); ab++ ) {
            _muab.push_back( Factor( grm().IR(ab->second) ) );
            _muba.push_back( Factor( grm().IR(ab->second) ) );
        }
    }